

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTruth.c
# Opt level: O2

uint * Aig_ManCutTruth(Aig_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,Vec_Ptr_t *vTruthElem,
                      Vec_Ptr_t *vTruthStore)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  Aig_Obj_t *pNode;
  uint *pTruth;
  int iVar4;
  char *__assertion;
  int iVar5;
  
  iVar5 = vLeaves->nSize;
  if (vTruthElem->nSize < iVar5) {
    __assertion = "Vec_PtrSize(vLeaves) <= Vec_PtrSize(vTruthElem)";
    uVar1 = 0x54;
  }
  else {
    uVar1 = vNodes->nSize;
    if ((int)uVar1 <= vTruthStore->nSize) {
      if ((ulong)uVar1 != 0) {
        if ((int)uVar1 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
        }
        if ((Aig_Obj_t *)vNodes->pArray[(ulong)uVar1 - 1] != pRoot) {
          __assertion = "Vec_PtrSize(vNodes) == 0 || pRoot == Vec_PtrEntryLast(vNodes)";
          uVar1 = 0x56;
          goto LAB_005834e5;
        }
      }
      for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
        pvVar2 = Vec_PtrEntry(vLeaves,iVar4);
        pvVar3 = Vec_PtrEntry(vTruthElem,iVar4);
        *(void **)((long)pvVar2 + 0x28) = pvVar3;
        iVar5 = vLeaves->nSize;
      }
      iVar4 = 1 << ((char)iVar5 - 5U & 0x1f);
      if (iVar5 < 6) {
        iVar4 = 1;
      }
      for (iVar5 = 0; iVar5 < vNodes->nSize; iVar5 = iVar5 + 1) {
        pNode = (Aig_Obj_t *)Vec_PtrEntry(vNodes,iVar5);
        pTruth = (uint *)Vec_PtrEntry(vTruthStore,iVar5);
        Aig_ManCutTruthOne(pNode,pTruth,iVar4);
        (pNode->field_5).pData = pTruth;
      }
      return (uint *)(pRoot->field_5).pData;
    }
    __assertion = "Vec_PtrSize(vNodes) <= Vec_PtrSize(vTruthStore)";
    uVar1 = 0x55;
  }
LAB_005834e5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTruth.c"
                ,uVar1,
                "unsigned int *Aig_ManCutTruth(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

unsigned * Aig_ManCutTruth( Aig_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Ptr_t * vTruthElem, Vec_Ptr_t * vTruthStore )
{
    Aig_Obj_t * pObj;
    int i, nWords;
    assert( Vec_PtrSize(vLeaves) <= Vec_PtrSize(vTruthElem) );
    assert( Vec_PtrSize(vNodes) <= Vec_PtrSize(vTruthStore) );
    assert( Vec_PtrSize(vNodes) == 0 || pRoot == Vec_PtrEntryLast(vNodes) );  
    // assign elementary truth tables
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->pData = Vec_PtrEntry( vTruthElem, i );
    // compute truths for other nodes
    nWords = Abc_TruthWordNum( Vec_PtrSize(vLeaves) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->pData = Aig_ManCutTruthOne( pObj, (unsigned *)Vec_PtrEntry(vTruthStore, i), nWords );
    return (unsigned *)pRoot->pData;
}